

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_monitor.c
# Opt level: O0

wl_output * glfwGetWaylandMonitor(GLFWmonitor *handle)

{
  _GLFWmonitor *monitor;
  GLFWmonitor *handle_local;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    handle_local = (GLFWmonitor *)0x0;
  }
  else if (_glfw.platform.platformID == 0x60003) {
    handle_local = *(GLFWmonitor **)(handle + 0x100);
  }
  else {
    _glfwInputError(0x1000e,"Wayland: Platform not initialized");
    handle_local = (GLFWmonitor *)0x0;
  }
  return (wl_output *)handle_local;
}

Assistant:

wl_output* glfwGetWaylandMonitor(GLFWmonitor* handle)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (_glfw.platform.platformID != GLFW_PLATFORM_WAYLAND)
    {
        _glfwInputError(GLFW_PLATFORM_UNAVAILABLE, "Wayland: Platform not initialized");
        return NULL;
    }

    return monitor->wl.output;
}